

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

void fe_spec2cep(fe_t *fe,powspec_t *mflogspec,mfcc_t *mfcep)

{
  int local_2c;
  int local_28;
  int32 beta;
  int32 j;
  int32 i;
  mfcc_t *mfcep_local;
  powspec_t *mflogspec_local;
  fe_t *fe_local;
  
  *mfcep = (mfcc_t)(float)((double)*mflogspec / 2.0);
  for (local_28 = 1; local_28 < fe->mel_fb->num_filters; local_28 = local_28 + 1) {
    *mfcep = (mfcc_t)(float)((double)(float)*mfcep + (double)mflogspec[local_28]);
  }
  *mfcep = (mfcc_t)((float)*mfcep / (float)fe->mel_fb->num_filters);
  for (beta = 1; beta < (int)(uint)fe->num_cepstra; beta = beta + 1) {
    mfcep[beta] = 0.0;
    for (local_28 = 0; local_28 < fe->mel_fb->num_filters; local_28 = local_28 + 1) {
      if (local_28 == 0) {
        local_2c = 1;
      }
      else {
        local_2c = 2;
      }
      mfcep[beta] = (mfcc_t)(float)((double)mflogspec[local_28] *
                                    (double)(float)fe->mel_fb->mel_cosine[beta][local_28] *
                                    (double)local_2c + (double)(float)mfcep[beta]);
    }
    mfcep[beta] = (mfcc_t)((float)mfcep[beta] / ((float)fe->mel_fb->num_filters * 2.0));
  }
  return;
}

Assistant:

void
fe_spec2cep(fe_t * fe, const powspec_t * mflogspec, mfcc_t * mfcep)
{
    int32 i, j, beta;

    /* Compute C0 separately (its basis vector is 1) to avoid
     * costly multiplications. */
    mfcep[0] = mflogspec[0] / 2;        /* beta = 0.5 */
    for (j = 1; j < fe->mel_fb->num_filters; j++)
        mfcep[0] += mflogspec[j];       /* beta = 1.0 */
    mfcep[0] /= (frame_t) fe->mel_fb->num_filters;

    for (i = 1; i < fe->num_cepstra; ++i) {
        mfcep[i] = 0;
        for (j = 0; j < fe->mel_fb->num_filters; j++) {
            if (j == 0)
                beta = 1;       /* 0.5 */
            else
                beta = 2;       /* 1.0 */
            mfcep[i] += COSMUL(mflogspec[j],
                               fe->mel_fb->mel_cosine[i][j]) * beta;
        }
        /* Note that this actually normalizes by num_filters, like the
         * original Sphinx front-end, due to the doubled 'beta' factor
         * above.  */
        mfcep[i] /= (frame_t) fe->mel_fb->num_filters * 2;
    }
}